

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_io.c
# Opt level: O1

int kvtree_open(char *file,int flags,...)

{
  uint __errnum;
  int iVar1;
  uint *puVar2;
  char *pcVar3;
  uint in_EDX;
  int iVar4;
  uint uVar5;
  bool bVar6;
  va_list ap;
  
  uVar5 = 0;
  if ((flags & 0x40U) != 0) {
    uVar5 = in_EDX;
  }
  if ((flags & 0x40U) == 0) {
    iVar1 = open(file,flags);
  }
  else {
    iVar1 = open(file,flags,(ulong)uVar5);
  }
  if (iVar1 < 0) {
    puVar2 = (uint *)__errno_location();
    __errnum = *puVar2;
    pcVar3 = strerror(__errnum);
    kvtree_dbg(1,"Opening file: open(%s) errno=%d %s @ %s:%d",file,(ulong)__errnum,pcVar3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_io.c"
               ,0x5a);
    iVar4 = -4;
    do {
      usleep(100);
      if ((flags & 0x40U) == 0) {
        iVar1 = open(file,flags);
      }
      else {
        iVar1 = open(file,flags,(ulong)uVar5);
      }
    } while ((iVar1 < 0) && (bVar6 = iVar4 != 0, iVar4 = iVar4 + 1, bVar6));
    if (iVar1 < 0) {
      uVar5 = *puVar2;
      pcVar3 = strerror(uVar5);
      kvtree_err("Opening file: open(%s) errno=%d %s @ %s:%d",file,(ulong)uVar5,pcVar3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_io.c"
                 ,0x6c);
    }
  }
  return iVar1;
}

Assistant:

int kvtree_open(const char* file, int flags, ...)
{
  /* extract the mode (see man 2 open) */
  int mode_set = 0;
  mode_t mode = 0;
  if (flags & O_CREAT) {
    va_list ap;
    va_start(ap, flags);
    mode = va_arg(ap, mode_t);
    va_end(ap);
    mode_set = 1;
  }

  int fd = -1;
  if (mode_set) {
    fd = open(file, flags, mode);
  } else {
    fd = open(file, flags);
  }
  if (fd < 0) {
    kvtree_dbg(1, "Opening file: open(%s) errno=%d %s @ %s:%d",
      file, errno, strerror(errno), __FILE__, __LINE__
    );

    /* try again */
    int tries = KVTREE_OPEN_TRIES;
    while (tries && fd < 0) {
      usleep(KVTREE_OPEN_USLEEP);
      if (mode_set) {
        fd = open(file, flags, mode);
      } else {
        fd = open(file, flags);
      }
      tries--;
    }

    /* if we still don't have a valid file, consider it an error */
    if (fd < 0) {
      kvtree_err("Opening file: open(%s) errno=%d %s @ %s:%d",
        file, errno, strerror(errno), __FILE__, __LINE__
      );
    }
  }
  return fd;
}